

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O2

mat4 * __thiscall Camera::get_view(mat4 *__return_storage_ptr__,Camera *this)

{
  vec<3,_float,_(glm::qualifier)0> *in_R8;
  vec<3,_float,_(glm::qualifier)0> vVar1;
  vec<3,_float,_(glm::qualifier)0> local_30;
  
  vVar1 = glm::detail::compute_cross<float,_(glm::qualifier)0,_false>::call
                    (&this->right,&this->direction);
  (this->up).field_0 = vVar1.field_0;
  (this->up).field_1 = vVar1.field_1;
  (this->up).field_2 = vVar1.field_2;
  local_30 = glm::operator+(&this->position,&this->direction);
  glm::lookAtRH<float,(glm::qualifier)0>
            (__return_storage_ptr__,(glm *)this,&local_30,&this->up,in_R8);
  return __return_storage_ptr__;
}

Assistant:

glm::mat4 Camera::get_view() {
    up = glm::cross(right, direction);
    return glm::lookAt(
        position,
        position+direction,
        up
    );
}